

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_websocket.hpp
# Opt level: O0

void __thiscall
m2d::savanna::async_websocket::raw_stream_logic::on_handshake_l
          (raw_stream_logic *this,error_code ec)

{
  element_type *this_00;
  function<void_(boost::beast::websocket::frame_type,_boost::basic_string_view<char,_std::char_traits<char>_>)>
  local_48;
  anon_class_8_1_8991fb9c local_28;
  anon_class_8_1_8991fb9c control_callback;
  raw_stream_logic *this_local;
  error_code ec_local;
  
  if (this->delegate_ != (delegate *)0x0) {
    local_28.this = this;
    control_callback.this = this;
    this_00 = std::
              __shared_ptr_access<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->raw_stream_);
    std::
    function<void(boost::beast::websocket::frame_type,boost::basic_string_view<char,std::char_traits<char>>)>
    ::
    function<m2d::savanna::async_websocket::raw_stream_logic::on_handshake_l(boost::system::error_code)::_lambda(boost::beast::websocket::frame_type,boost::basic_string_view<char,std::char_traits<char>>)_1_&,void>
              ((function<void(boost::beast::websocket::frame_type,boost::basic_string_view<char,std::char_traits<char>>)>
                *)&local_48,&local_28);
    boost::beast::websocket::
    stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>
    ::control_callback(this_00,&local_48);
    std::
    function<void_(boost::beast::websocket::frame_type,_boost::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function(&local_48);
    (**this->delegate_->_vptr_delegate)();
  }
  return;
}

Assistant:

void on_handshake_l(beast::error_code ec) override
			{
				// success
				if (delegate_) {
					auto control_callback = [this](beast::websocket::frame_type kind, boost::string_view payload) {
						delegate_->control_callback(kind, payload);
					};
					raw_stream_->control_callback(control_callback);
					delegate_->on_ready();
				}
			}